

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

Vector<float,_2> __thiscall
deqp::gles3::Performance::mean<2>
          (Performance *this,
          vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *data)

{
  pointer pVVar1;
  ulong uVar2;
  long lVar3;
  int i;
  long lVar4;
  Vector<float,_2> VVar5;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    pVVar1 = (data->
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(data->
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
    if ((int)(uVar2 >> 3) <= lVar4) break;
    tcu::Vector<float,_2>::operator+=(&local_38,(Vector<float,_2> *)((long)pVVar1->m_data + lVar3));
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 8;
  }
  local_30.m_data[0] = (float)(ulong)((long)uVar2 >> 3);
  local_30.m_data[1] = local_30.m_data[0];
  VVar5 = tcu::operator/(&local_38,&local_30);
  return (Vector<float,_2>)VVar5.m_data;
}

Assistant:

static tcu::Vector<float, N> mean (const vector<tcu::Vector<float, N> >& data)
{
	tcu::Vector<float, N> sum(0.0f);
	for (int i = 0; i < (int)data.size(); i++)
		sum += data[i];
	return sum / tcu::Vector<float, N>((float)data.size());
}